

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

SmallBuffer * __thiscall
helics::JsonTranslatorOperator::convertToValue
          (JsonTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  SmallBuffer *in_RDI;
  defV val;
  data_view *in_stack_00000208;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  data_view *in_stack_ffffffffffffff10;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_78;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_48;
  
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)0x3f33fe);
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x3f3408);
  SmallBuffer::to_string((SmallBuffer *)0x3f3414);
  data_view::data_view<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  readJsonValue_abi_cxx11_(in_stack_00000208);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::operator=(&local_48,&local_78);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)0x3f3483);
  data_view::~data_view((data_view *)0x3f348d);
  typeConvertDefV((defV *)in_RDI);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)0x3f34ab);
  return in_RDI;
}

Assistant:

SmallBuffer JsonTranslatorOperator::convertToValue(std::unique_ptr<Message> message)
{
    defV val;
    val = readJsonValue(message->data.to_string());
    return typeConvertDefV(val);
}